

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bitstream.cpp
# Opt level: O1

bool slang::ast::withAfterDynamic
               (StreamingConcatenationExpression *lhs,SourceRange **dynamic,SourceRange **with)

{
  size_t sVar1;
  pointer pSVar2;
  StreamingConcatenationExpression *lhs_00;
  long lVar3;
  bool bVar4;
  long lVar5;
  bool bVar6;
  
  sVar1 = (lhs->streams_)._M_extent._M_extent_value;
  bVar6 = sVar1 != 0;
  if (bVar6) {
    pSVar2 = (lhs->streams_)._M_ptr;
    lVar5 = 0;
    do {
      lhs_00 = *(StreamingConcatenationExpression **)((long)&(pSVar2->operand).ptr + lVar5);
      if ((lhs_00->super_Expression).kind == Streaming) {
        bVar4 = withAfterDynamic(lhs_00,dynamic,with);
        if (bVar4) {
          return bVar6;
        }
      }
      else {
        lVar3 = *(long *)((long)&pSVar2->withExpr + lVar5);
        if (lVar3 == 0) {
          if ((*dynamic == (SourceRange *)0x0) &&
             (bVar6 = Type::isFixedSize((lhs_00->super_Expression).type.ptr), !bVar6)) {
            *dynamic = &(lhs_00->super_Expression).sourceRange;
          }
        }
        else {
          *with = (SourceRange *)(lVar3 + 0x20);
          if (*dynamic != (SourceRange *)0x0) {
            return bVar6;
          }
        }
      }
      lVar5 = lVar5 + 0x18;
      bVar6 = sVar1 * 0x18 != lVar5;
    } while (bVar6);
  }
  return bVar6;
}

Assistant:

static bool withAfterDynamic(const StreamingConcatenationExpression& lhs,
                             const SourceRange*& dynamic, const SourceRange*& with) {
    // The expression within the "with" is evaluated immediately before its corresponding array is
    // streamed. The first dynamically sized item without "with" constraints accept all the
    // available data. If the former appears after the latter, evaluation order has conflict.
    for (auto& stream : lhs.streams()) {
        auto& operand = *stream.operand;
        if (operand.kind == ExpressionKind::Streaming) {
            if (withAfterDynamic(operand.as<StreamingConcatenationExpression>(), dynamic, with))
                return true;
        }
        else if (stream.withExpr) {
            with = &stream.withExpr->sourceRange;
            if (dynamic)
                return true;
        }
        else if (!dynamic && !operand.type->isFixedSize()) {
            dynamic = &operand.sourceRange;
        }
    }
    return false;
}